

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t zeGetModuleProcAddrTable(ze_api_version_t version,ze_module_dditable_t *pDdiTable)

{
  ze_pfnModuleDestroy_t p_Var1;
  ze_pfnModuleGetNativeBinary_t p_Var2;
  ze_pfnModuleGetKernelNames_t p_Var3;
  ze_pfnModuleGetFunctionPointer_t p_Var4;
  ze_api_version_t *pzVar5;
  ze_result_t zVar6;
  
  pzVar5 = validation_layer::context;
  if (pDdiTable == (ze_module_dditable_t *)0x0) {
    zVar6 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      p_Var1 = pDdiTable->pfnDestroy;
      *(ze_pfnModuleCreate_t *)(validation_layer::context + 0x140) = pDdiTable->pfnCreate;
      *(ze_pfnModuleDestroy_t *)(pzVar5 + 0x142) = p_Var1;
      pDdiTable->pfnCreate = validation_layer::zeModuleCreate;
      pDdiTable->pfnDestroy = validation_layer::zeModuleDestroy;
      p_Var2 = pDdiTable->pfnGetNativeBinary;
      *(ze_pfnModuleDynamicLink_t *)(pzVar5 + 0x144) = pDdiTable->pfnDynamicLink;
      *(ze_pfnModuleGetNativeBinary_t *)(pzVar5 + 0x146) = p_Var2;
      pDdiTable->pfnDynamicLink = validation_layer::zeModuleDynamicLink;
      pDdiTable->pfnGetNativeBinary = validation_layer::zeModuleGetNativeBinary;
      p_Var3 = pDdiTable->pfnGetKernelNames;
      *(ze_pfnModuleGetGlobalPointer_t *)(pzVar5 + 0x148) = pDdiTable->pfnGetGlobalPointer;
      *(ze_pfnModuleGetKernelNames_t *)(pzVar5 + 0x14a) = p_Var3;
      pDdiTable->pfnGetGlobalPointer = validation_layer::zeModuleGetGlobalPointer;
      pDdiTable->pfnGetKernelNames = validation_layer::zeModuleGetKernelNames;
      p_Var4 = pDdiTable->pfnGetFunctionPointer;
      *(ze_pfnModuleGetProperties_t *)(pzVar5 + 0x14c) = pDdiTable->pfnGetProperties;
      *(ze_pfnModuleGetFunctionPointer_t *)(pzVar5 + 0x14e) = p_Var4;
      pDdiTable->pfnGetProperties = validation_layer::zeModuleGetProperties;
      pDdiTable->pfnGetFunctionPointer = validation_layer::zeModuleGetFunctionPointer;
      *(ze_pfnModuleInspectLinkageExt_t *)(pzVar5 + 0x150) = pDdiTable->pfnInspectLinkageExt;
      pDdiTable->pfnInspectLinkageExt = validation_layer::zeModuleInspectLinkageExt;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar6;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetModuleProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_module_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zeDdiTable.Module;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreate                                   = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate                                 = validation_layer::zeModuleCreate;

    dditable.pfnDestroy                                  = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy                                = validation_layer::zeModuleDestroy;

    dditable.pfnDynamicLink                              = pDdiTable->pfnDynamicLink;
    pDdiTable->pfnDynamicLink                            = validation_layer::zeModuleDynamicLink;

    dditable.pfnGetNativeBinary                          = pDdiTable->pfnGetNativeBinary;
    pDdiTable->pfnGetNativeBinary                        = validation_layer::zeModuleGetNativeBinary;

    dditable.pfnGetGlobalPointer                         = pDdiTable->pfnGetGlobalPointer;
    pDdiTable->pfnGetGlobalPointer                       = validation_layer::zeModuleGetGlobalPointer;

    dditable.pfnGetKernelNames                           = pDdiTable->pfnGetKernelNames;
    pDdiTable->pfnGetKernelNames                         = validation_layer::zeModuleGetKernelNames;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = validation_layer::zeModuleGetProperties;

    dditable.pfnGetFunctionPointer                       = pDdiTable->pfnGetFunctionPointer;
    pDdiTable->pfnGetFunctionPointer                     = validation_layer::zeModuleGetFunctionPointer;

    dditable.pfnInspectLinkageExt                        = pDdiTable->pfnInspectLinkageExt;
    pDdiTable->pfnInspectLinkageExt                      = validation_layer::zeModuleInspectLinkageExt;

    return result;
}